

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreStructs.cpp
# Opt level: O3

aiMatrix4x4 * __thiscall Assimp::Ogre::TransformKeyFrame::Transform(TransformKeyFrame *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  aiMatrix4x4 *in_RDI;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  
  fVar7 = (this->rotation).w;
  fVar9 = (this->rotation).z;
  fVar1 = (this->scale).x;
  in_RDI->a4 = (this->position).x;
  fVar2 = (this->scale).y;
  in_RDI->b4 = (this->position).y;
  uVar4 = (this->rotation).x;
  uVar5 = (this->rotation).y;
  fVar10 = (float)uVar4 * fVar9 + (float)uVar5 * fVar7;
  fVar11 = (float)uVar5 * fVar9 - fVar7 * (float)uVar4;
  fVar3 = (this->scale).z;
  fVar12 = (float)uVar5 * (float)uVar5 + fVar9 * fVar9;
  fVar14 = (float)uVar4 * (float)uVar5 - fVar9 * fVar7;
  fVar13 = (float)uVar4 * (float)uVar5 + fVar9 * fVar7;
  fVar8 = fVar9 * fVar9 + (float)uVar4 * (float)uVar4;
  fVar6 = fVar9 * (float)uVar4 + fVar7 * -(float)uVar5;
  fVar7 = fVar9 * (float)uVar5 + (float)uVar4 * fVar7;
  fVar9 = (float)uVar4 * (float)uVar4 + (float)uVar5 * (float)uVar5;
  in_RDI->a1 = (1.0 - (fVar12 + fVar12)) * fVar1;
  in_RDI->a2 = (fVar14 + fVar14) * fVar1;
  in_RDI->a3 = (fVar10 + fVar10) * fVar1;
  in_RDI->b1 = (fVar13 + fVar13) * fVar2;
  in_RDI->b2 = (1.0 - (fVar8 + fVar8)) * fVar2;
  in_RDI->b3 = (fVar11 + fVar11) * fVar2;
  in_RDI->c1 = fVar3 * (fVar6 + fVar6);
  in_RDI->c2 = fVar3 * (fVar7 + fVar7);
  in_RDI->c3 = (1.0 - (fVar9 + fVar9)) * fVar3;
  in_RDI->c4 = (this->position).z;
  in_RDI->d1 = 0.0;
  in_RDI->d2 = 0.0;
  in_RDI->d3 = 0.0;
  in_RDI->d4 = 1.0;
  return in_RDI;
}

Assistant:

aiMatrix4x4 TransformKeyFrame::Transform()
{
    return aiMatrix4x4(scale, rotation, position);
}